

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

Bbl_Man_t * Bbl_ManStart(char *pName)

{
  Bbl_Man_t *pBVar1;
  size_t sVar2;
  Vec_Str_t *pVVar3;
  Vec_Int_t *pVVar4;
  int nSize;
  
  pBVar1 = (Bbl_Man_t *)calloc(1,0x4d0);
  if (pName == (char *)0x0) {
    pVVar3 = Vec_StrAlloc(0);
    pVVar3->nSize = pVVar3->nCap;
  }
  else {
    sVar2 = strlen(pName);
    pVVar3 = Vec_StrAlloc(((int)sVar2 + 1U & 0xfffffffc) + 4);
    pVVar3->nSize = pVVar3->nCap;
    strcpy(pVVar3->pArray,pName);
  }
  pBVar1->pName = pVVar3;
  pVVar3 = Vec_StrAlloc(0x10000);
  pBVar1->pObjs = pVVar3;
  pVVar3 = Vec_StrAlloc(0x10000);
  pBVar1->pFncs = pVVar3;
  nSize = 0x10000;
  pVVar3 = Vec_StrAlloc(0x10000);
  pBVar1->pEnts = pVVar3;
  pVVar3->nSize = 1;
  pVVar4 = Vec_IntStart(nSize);
  pBVar1->vId2Obj = pVVar4;
  pVVar4 = Vec_IntStart(nSize);
  pBVar1->vFaninNums = pVVar4;
  return pBVar1;
}

Assistant:

Bbl_Man_t * Bbl_ManStart( char * pName )
{
    Bbl_Man_t * p;
    int nLength;
    p = BBLIF_ALLOC( Bbl_Man_t, 1 );
    memset( p, 0, sizeof(Bbl_Man_t) );
    nLength = pName? 4 * ((strlen(pName) + 1) / 4 + 1) : 0;
    p->pName  = Vec_StrAlloc( nLength );
    p->pName->nSize = p->pName->nCap;
    if ( pName )
        strcpy( p->pName->pArray, pName );
    p->pObjs = Vec_StrAlloc( 1 << 16 );
    p->pFncs = Vec_StrAlloc( 1 << 16 );
    p->pEnts = Vec_StrAlloc( 1 << 16 ); p->pEnts->nSize = 1;
    p->vId2Obj = Vec_IntStart( 1 << 10 );
    p->vFaninNums = Vec_IntStart( 1 << 10 );
    return p;
}